

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O1

void __thiscall
t_py_generator::generate_serialize_field
          (t_py_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  t_type *ttype;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  t_struct *tstruct;
  t_base_type *this_00;
  undefined1 auVar7 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar3 != '\0') {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&local_b0,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar6,&local_b0,&tfield->name_);
    __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar3 == '\0')) {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if (((char)iVar3 == '\0') &&
         (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar3 == '\0')) {
        pcVar1 = (prefix->_M_dataplus)._M_p;
        pcVar2 = (tfield->name_)._M_dataplus._M_p;
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
        printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",pcVar1,pcVar2,
               *(undefined8 *)CONCAT44(extraout_var,iVar3));
        return;
      }
      std::operator+(&local_b0,prefix,&tfield->name_);
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"oprot.",6);
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
        if ((char)iVar3 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32(",9);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        }
      }
      else {
        this_00 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
        poVar5 = out;
        switch(this_00) {
        case (t_base_type *)0x0:
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar6,"compiler error: cannot serialize void field in a struct: ",
                         &local_b0);
          __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        case (t_base_type *)0x1:
          iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
          if ((char)iVar3 == '\0') {
            if (this->gen_utf8strings_ == false) {
              std::__ostream_insert<char,std::char_traits<char>>(out,"writeString(",0xc);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(out,"writeString(",0xc);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,".encode(\'utf-8\') if sys.version_info[0] == 2 else ",0x32);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeBinary(",0xc);
          }
          break;
        case (t_base_type *)0x2:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeBool(",10);
          break;
        case (t_base_type *)0x3:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeByte(",10);
          break;
        case (t_base_type *)0x4:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI16(",9);
          break;
        case (t_base_type *)0x5:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32(",9);
          break;
        case (t_base_type *)0x6:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI64(",9);
          break;
        case (t_base_type *)0x7:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeDouble(",0xc);
          break;
        default:
          auVar7 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_(&local_90,this_00,auVar7._8_4_);
          std::operator+(auVar7._0_8_,"compiler error: no Python name for base type ",&local_90);
          __cxa_throw(auVar7._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      paVar4 = &local_b0.field_2;
    }
    else {
      std::operator+(&local_70,prefix,&tfield->name_);
      generate_serialize_container(this,out,ttype,&local_70);
      paVar4 = &local_70.field_2;
    }
  }
  else {
    std::operator+(&local_50,prefix,&tfield->name_);
    generate_serialize_struct(this,out,tstruct,&local_50);
    paVar4 = &local_50.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar4->_M_local_buf + -0x10) != paVar4) {
    operator_delete(*(undefined1 **)(paVar4->_M_local_buf + -0x10));
  }
  return;
}

Assistant:

void t_py_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + tfield->get_name());
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + tfield->get_name());
  } else if (type->is_base_type() || type->is_enum()) {

    string name = prefix + tfield->get_name();

    indent(out) << "oprot.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          out << "writeBinary(" << name << ")";
        } else if (!gen_utf8strings_) {
          out << "writeString(" << name << ")";
        } else {
          out << "writeString(" << name << ".encode('utf-8') if sys.version_info[0] == 2 else " << name << ")";
        }
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ")";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ")";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ")";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ")";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ")";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ")";
        break;
      default:
        throw "compiler error: no Python name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "writeI32(" << name << ")";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}